

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O2

TIntermConstantUnion * __thiscall
glslang::TIntermediate::addConstantUnion(TIntermediate *this,int i,TSourceLoc *loc,bool literal)

{
  pointer pTVar1;
  TIntermConstantUnion *pTVar2;
  TIntermediate *this_00;
  TConstUnionArray unionArray;
  
  TConstUnionArray::TConstUnionArray(&unionArray,1);
  pTVar1 = ((unionArray.unionArray)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (pTVar1->field_0).iConst = i;
  pTVar1->type = EbtInt;
  this_00 = (TIntermediate *)&stack0xffffffffffffff38;
  TType::TType((TType *)&stack0xffffffffffffff38,EbtInt,EvqConst,1,0,0,false);
  pTVar2 = addConstantUnion(this_00,&unionArray,(TType *)&stack0xffffffffffffff38,loc,literal);
  return pTVar2;
}

Assistant:

TIntermConstantUnion* TIntermediate::addConstantUnion(int i, const TSourceLoc& loc, bool literal) const
{
    TConstUnionArray unionArray(1);
    unionArray[0].setIConst(i);

    return addConstantUnion(unionArray, TType(EbtInt, EvqConst), loc, literal);
}